

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O0

void __thiscall
HeuristicNeighbourhood::HeuristicNeighbourhood
          (HeuristicNeighbourhood *this,HighsMipSolver *mipsolver,HighsDomain *localdom)

{
  int iVar1;
  HighsHashTable<int,_void> *pHVar2;
  bool bVar3;
  vector<HighsDomainChange,_std::allocator<HighsDomainChange>_> *this_00;
  size_type sVar4;
  pointer pHVar5;
  reference piVar6;
  reference pvVar7;
  _Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false> in_RDX;
  HighsHashTable<int,_void> *in_RDI;
  HighsInt i;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_ffffffffffffff90;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  vector<int,_std::allocator<int>_> *local_30;
  HighsDomain *local_18;
  
  (in_RDI->entries)._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>.
  _M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>.
  super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl = in_RDX._M_head_impl;
  *(undefined4 *)
   &(in_RDI->metadata)._M_t.
    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
    super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = 0;
  local_18 = (HighsDomain *)in_RDX._M_head_impl;
  HighsHashTable<int,_void>::HighsHashTable(in_RDI);
  pHVar2 = in_RDI + 1;
  this_00 = HighsDomain::getDomainChangeStack(local_18);
  sVar4 = std::vector<HighsDomainChange,_std::allocator<HighsDomainChange>_>::size(this_00);
  pHVar2->tableSizeMask = sVar4;
  in_RDI[1].numHashShift = in_RDI[1].tableSizeMask;
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x683abc);
  local_30 = &pHVar5->integral_cols;
  local_38._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff88);
  std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff90,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_ffffffffffffff88);
    if (!bVar3) break;
    piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_38);
    iVar1 = *piVar6;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&local_18->col_lower_,(long)iVar1);
    in_stack_ffffffffffffff90 =
         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)*pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&local_18->col_upper_,(long)iVar1);
    if (((double)in_stack_ffffffffffffff90 == *pvVar7) &&
       (!NAN((double)in_stack_ffffffffffffff90) && !NAN(*pvVar7))) {
      *(int *)&(in_RDI->metadata)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
           *(int *)&(in_RDI->metadata)._M_t.
                    super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t
                    .super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                    super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 1;
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_38);
  }
  pHVar5 = std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                     ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                      0x683b9d);
  sVar4 = std::vector<int,_std::allocator<int>_>::size(&pHVar5->integral_cols);
  *(int *)&in_RDI[1].numElements =
       (int)sVar4 -
       *(int *)&(in_RDI->metadata)._M_t.
                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  return;
}

Assistant:

HeuristicNeighbourhood(HighsMipSolver& mipsolver, HighsDomain& localdom)
      : localdom(localdom),
        numFixed(0),
        startCheckedChanges(localdom.getDomainChangeStack().size()),
        nCheckedChanges(startCheckedChanges) {
    for (HighsInt i : mipsolver.mipdata_->integral_cols)
      if (localdom.col_lower_[i] == localdom.col_upper_[i]) ++numFixed;

    numTotal = mipsolver.mipdata_->integral_cols.size() - numFixed;
  }